

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O0

void __thiscall FIX::Session::setResponder(Session *this,Responder *pR)

{
  bool bVar1;
  UtcTimeStamp local_30;
  Responder *local_18;
  Responder *pR_local;
  Session *this_local;
  
  local_18 = pR;
  pR_local = (Responder *)this;
  if ((this->m_refreshOnLogon & 1U) != 0) {
    refresh(this);
  }
  std::function<FIX::UtcTimeStamp_()>::operator()(&local_30,&this->m_timestamper);
  bVar1 = checkSessionTime(this,&local_30);
  UtcTimeStamp::~UtcTimeStamp(&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    reset(this);
  }
  this->m_pResponder = local_18;
  return;
}

Assistant:

void setResponder(Responder *pR) {
    if (m_refreshOnLogon) {
      refresh();
    }
    if (!checkSessionTime(m_timestamper())) {
      reset();
    }
    m_pResponder = pR;
  }